

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O2

void __thiscall
SmallArray<LlvmCompilationContext::LoopInfo,_32U>::~SmallArray
          (SmallArray<LlvmCompilationContext::LoopInfo,_32U> *this)

{
  LoopInfo *pLVar1;
  
  pLVar1 = this->data;
  if (pLVar1 != this->little) {
    if (this->allocator == (Allocator *)0x0) {
      if (pLVar1 != (LoopInfo *)0x0) {
        (*(code *)NULLC::dealloc)(pLVar1);
      }
    }
    else if (pLVar1 != (LoopInfo *)0x0) {
      (*this->allocator->_vptr_Allocator[3])();
    }
  }
  return;
}

Assistant:

~SmallArray()
	{
		if(data != little)
		{
			if(allocator)
				allocator->destruct(data, max);
			else
				NULLC::destruct(data, max);
		}
	}